

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O3

void __thiscall Cgmres<Model>::control(Cgmres<Model> *this,double *u,double *x)

{
  double dVar1;
  double *pdVar2;
  double *x_00;
  double dVar3;
  int16_t i;
  long lVar4;
  int16_t i_1;
  double b_vec [150];
  double U_buf [150];
  double local_978 [300];
  
  pdVar2 = this->U;
  x_00 = this->x_dxh;
  dVar1 = x[1];
  *x_00 = dVar1;
  x_00[1] = -*x - dVar1 * *pdVar2;
  *x_00 = *x_00 * 0.002;
  x_00[1] = x_00[1] * 0.002;
  lVar4 = 0;
  do {
    x_00[lVar4] = x_00[lVar4] + x[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2);
  F_func(this,this->F_dxh_h,pdVar2,x_00,this->t + 0.002);
  F_func(this,local_978,this->U,x,this->t);
  lVar4 = 0;
  do {
    local_978[lVar4] = -local_978[lVar4];
    local_978[lVar4 + 1] = -local_978[lVar4 + 1];
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x96);
  pdVar2 = this->F_dxh_h;
  lVar4 = 0;
  do {
    local_978[lVar4] = local_978[lVar4] - pdVar2[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x96);
  lVar4 = 0;
  do {
    local_978[lVar4] = local_978[lVar4] * 500.0;
    local_978[lVar4 + 1] = local_978[lVar4 + 1] * 500.0;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x96);
  Gmres::gmres(&this->super_Gmres,this->dUdt,local_978);
  pdVar2 = this->dUdt;
  lVar4 = 0;
  do {
    dVar1 = (pdVar2 + lVar4)[1];
    local_978[lVar4 + 0x96] = pdVar2[lVar4] * 0.001;
    local_978[lVar4 + 0x97] = dVar1 * 0.001;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x96);
  pdVar2 = this->U;
  lVar4 = 0;
  do {
    dVar3 = (pdVar2 + lVar4)[1];
    dVar1 = local_978[lVar4 + 0x97];
    pdVar2[lVar4] = pdVar2[lVar4] + local_978[lVar4 + 0x96];
    (pdVar2 + lVar4)[1] = dVar3 + dVar1;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x96);
  this->t = this->t + 0.001;
  lVar4 = 0;
  do {
    u[lVar4] = pdVar2[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  return;
}

Assistant:

void control(double* u, const double* x) {
    double b_vec[len];
    double U_buf[len];

    // x + dxdt * h
    Model::dxdt(x_dxh, x, &U[0], &ptau[0]);
    mul(x_dxh, x_dxh, h, dim_x);
    add(x_dxh, x_dxh, x, dim_x);

    // F(U, x + dxdt * h, t + h)
    F_func(F_dxh_h, U, x_dxh, t + h);

    // F(U, x, t)
    F_func(b_vec, U, x, t);

    // (F(U, x, t) * (1 - zeta * h) - F(U, x + dxdt * h, t + h)) / h
    mul(b_vec, b_vec, (1 - zeta * h), len);
    sub(b_vec, b_vec, F_dxh_h, len);
    div(b_vec, b_vec, h, len);

    // GMRES
    gmres(dUdt, b_vec);

    // U = U + dUdt * dt
    mul(U_buf, dUdt, dt, len);
    add(U, U, U_buf, len);

    // t = t + dt
    // This value may not overflow due to loss of trailing digits
    t = t + dt;

    mov(u, &U[0], dim_u);
  }